

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryOperator.cpp
# Opt level: O0

ptr<Value> __thiscall BinaryOperator::evaluate(BinaryOperator *this,Environment *env)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar3;
  undefined1 local_40 [8];
  ptr<Value> rightValue;
  ptr<Value> leftValue;
  Environment *env_local;
  BinaryOperator *this_local;
  ptr<Value> *result;
  
  peVar1 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(env->symbols)._M_h._M_bucket_count);
  (**peVar1->_vptr_Expression)
            (&rightValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,peVar1,
             in_RDX);
  peVar1 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(env->symbols)._M_h._M_element_count);
  (**peVar1->_vptr_Expression)(local_40,peVar1,in_RDX);
  peVar2 = std::__shared_ptr_access<Operation,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Operation,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(env->symbols)._M_h._M_rehash_policy._M_next_resize);
  (*peVar2->_vptr_Operation[6])
            (this,peVar2,
             &rightValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,local_40)
  ;
  std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)local_40);
  std::shared_ptr<Value>::~shared_ptr
            ((shared_ptr<Value> *)
             &rightValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> BinaryOperator::evaluate(Environment* env) {
    ptr<Value> leftValue = leftExpression->evaluate(env);
    ptr<Value> rightValue = rightExpression->evaluate(env);

    ptr<Value> result = operation -> getResult(leftValue, rightValue);
    return result;
}